

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.cpp
# Opt level: O2

void __thiscall
adios2::core::Stream::Stream
          (Stream *this,string *name,Mode mode,string *configFile,string *ioInConfigFile,
          string *hostLanguage)

{
  string hostLanguage_00;
  undefined1 in_stack_ffffffffffffff60 [24];
  string local_70;
  string local_50 [32];
  
  helper::CommDummy();
  std::__cxx11::string::string((string *)&local_70,(string *)configFile);
  std::__cxx11::string::string((string *)&stack0xffffffffffffff70,(string *)ioInConfigFile);
  std::__cxx11::string::string(local_50,(string *)hostLanguage);
  hostLanguage_00._M_string_length = in_stack_ffffffffffffff60._0_8_;
  hostLanguage_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffff60._8_16_;
  hostLanguage_00._M_dataplus._M_p = (pointer)local_50;
  Stream(this,name,mode,(Comm *)&stack0xffffffffffffff68,&local_70,
         (string *)&stack0xffffffffffffff70,hostLanguage_00);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  std::__cxx11::string::~string((string *)&local_70);
  helper::Comm::~Comm((Comm *)&stack0xffffffffffffff68);
  return;
}

Assistant:

Stream::Stream(const std::string &name, const Mode mode, const std::string configFile,
               const std::string ioInConfigFile, const std::string hostLanguage)
: Stream(name, mode, helper::CommDummy(), configFile, ioInConfigFile, hostLanguage)
{
}